

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script_standard_tests.cpp
# Opt level: O2

void __thiscall
script_standard_tests::script_standard_GetScriptFor_::test_method
          (script_standard_GetScriptFor_ *this)

{
  long lVar1;
  undefined8 uVar2;
  bool bVar3;
  long lVar4;
  CScript *pCVar5;
  CSHA256 *this_00;
  uint uVar6;
  iterator in_R8;
  iterator pvVar7;
  iterator in_R9;
  iterator pvVar8;
  CKey *this_01;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  check_type cVar9;
  char *local_408;
  char *local_400;
  undefined1 *local_3f8;
  undefined1 *local_3f0;
  char *local_3e8;
  char *local_3e0;
  char *local_3d8;
  char *local_3d0;
  undefined1 *local_3c8;
  undefined1 *local_3c0;
  char *local_3b8;
  char *local_3b0;
  char *local_3a8;
  char *local_3a0;
  undefined1 *local_398;
  undefined1 *local_390;
  char *local_388;
  char *local_380;
  char *local_378;
  char *local_370;
  undefined1 *local_368;
  undefined1 *local_360;
  char *local_358;
  char *local_350;
  char *local_348;
  char *local_340;
  undefined1 *local_338;
  undefined1 *local_330;
  char *local_328;
  char *local_320;
  char *local_318;
  char *local_310;
  undefined1 *local_308;
  undefined1 *local_300;
  char *local_2f8;
  char *local_2f0;
  char *local_2e8;
  char *local_2e0;
  undefined1 *local_2d8;
  undefined1 *local_2d0;
  char *local_2c8;
  char *local_2c0;
  char *local_2b8;
  char *local_2b0;
  undefined1 *local_2a8;
  undefined1 *local_2a0;
  char *local_298;
  char *local_290;
  pointer local_288;
  pointer puStack_280;
  pointer local_278;
  uchar auStack_270 [8];
  undefined1 local_268 [32];
  undefined1 local_248 [72];
  __index_type local_200;
  uint256 scriptHash;
  CScript witnessScript;
  CScript redeemScript;
  CScript result;
  CScript expected;
  CPubKey pubkeys [3];
  undefined1 local_75 [13];
  CKey keys [3];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  lVar4 = 8;
  do {
    local_75[lVar4 + 5] = 0;
    *(undefined8 *)(&keys[0].fCompressed + lVar4) = 0;
    lVar4 = lVar4 + 0x10;
  } while (lVar4 != 0x38);
  pubkeys[0].vch[0] = 0xff;
  pubkeys[1].vch[0] = 0xff;
  pubkeys[2].vch[0] = 0xff;
  this_01 = keys;
  lVar4 = 0;
  while( true ) {
    if (lVar4 == 0xc3) break;
    CKey::MakeNewKey(this_01,true);
    CKey::GetPubKey((CPubKey *)local_248,this_01);
    memcpy(pubkeys[0].vch + lVar4,(CPubKey *)local_248,0x41);
    lVar4 = lVar4 + 0x41;
    this_01 = this_01 + 1;
  }
  expected.super_CScriptBase._union._16_8_ = 0;
  expected.super_CScriptBase._24_8_ = 0;
  expected.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  expected.super_CScriptBase._union._8_8_ = 0;
  result.super_CScriptBase._union._16_8_ = 0;
  result.super_CScriptBase._24_8_ = 0;
  result.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  result.super_CScriptBase._union._8_8_ = 0;
  CScript::clear(&expected);
  pCVar5 = CScript::operator<<(&expected,OP_DUP);
  pCVar5 = CScript::operator<<(pCVar5,OP_HASH160);
  CPubKey::GetID((CKeyID *)&redeemScript,pubkeys);
  ToByteVector<CKeyID>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_248,
             (CKeyID *)&redeemScript);
  pCVar5 = CScript::operator<<(pCVar5,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                      local_248);
  pCVar5 = CScript::operator<<(pCVar5,OP_EQUALVERIFY);
  CScript::operator<<(pCVar5,OP_CHECKSIG);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_248);
  PKHash::PKHash((PKHash *)&witnessScript,pubkeys);
  local_248._16_4_ = witnessScript.super_CScriptBase._union._16_4_;
  local_248._0_8_ = witnessScript.super_CScriptBase._union.indirect_contents.indirect;
  local_248._8_8_ = witnessScript.super_CScriptBase._union._8_8_;
  local_200 = '\x02';
  GetScriptForDestination(&redeemScript,(CTxDestination *)local_248);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&result.super_CScriptBase,&redeemScript.super_CScriptBase);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&redeemScript.super_CScriptBase);
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)local_248);
  local_298 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_290 = "";
  local_2a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x126;
  file.m_begin = (iterator)&local_298;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_2a8,msg);
  redeemScript.super_CScriptBase._union.direct[0] =
       prevector<28U,_unsigned_char,_unsigned_int,_int>::operator==
                 (&result.super_CScriptBase,&expected.super_CScriptBase);
  redeemScript.super_CScriptBase._union._8_8_ = 0;
  redeemScript.super_CScriptBase._union._16_8_ = 0;
  witnessScript.super_CScriptBase._union.indirect_contents.indirect = "result == expected";
  witnessScript.super_CScriptBase._union._8_8_ = (long)"result == expected" + 0x12;
  local_248._8_8_ = local_248._8_8_ & 0xffffffffffffff00;
  local_248._0_8_ = &PTR__lazy_ostream_011481f0;
  local_248._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_2b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_2b0 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  local_248._24_8_ = &witnessScript;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&redeemScript,(lazy_ostream *)local_248,1,0,WARN,_cVar9,
             (size_t)&local_2b8,0x126);
  boost::detail::shared_count::~shared_count
            ((shared_count *)((long)&redeemScript.super_CScriptBase._union + 0x10));
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
            (&redeemScript.super_CScriptBase,&result.super_CScriptBase);
  CScript::clear(&expected);
  pCVar5 = CScript::operator<<(&expected,OP_HASH160);
  CScriptID::CScriptID((CScriptID *)&witnessScript,&redeemScript);
  ToByteVector<CScriptID>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_248,
             (CScriptID *)&witnessScript);
  pCVar5 = CScript::operator<<(pCVar5,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                      local_248);
  CScript::operator<<(pCVar5,OP_EQUAL);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_248);
  ScriptHash::ScriptHash((ScriptHash *)&scriptHash,&redeemScript);
  local_248[0x10] = scriptHash.super_base_blob<256U>.m_data._M_elems[0x10];
  local_248[0x11] = scriptHash.super_base_blob<256U>.m_data._M_elems[0x11];
  local_248[0x12] = scriptHash.super_base_blob<256U>.m_data._M_elems[0x12];
  local_248[0x13] = scriptHash.super_base_blob<256U>.m_data._M_elems[0x13];
  local_248[0] = scriptHash.super_base_blob<256U>.m_data._M_elems[0];
  local_248[1] = scriptHash.super_base_blob<256U>.m_data._M_elems[1];
  local_248[2] = scriptHash.super_base_blob<256U>.m_data._M_elems[2];
  local_248[3] = scriptHash.super_base_blob<256U>.m_data._M_elems[3];
  local_248[4] = scriptHash.super_base_blob<256U>.m_data._M_elems[4];
  local_248[5] = scriptHash.super_base_blob<256U>.m_data._M_elems[5];
  local_248[6] = scriptHash.super_base_blob<256U>.m_data._M_elems[6];
  local_248[7] = scriptHash.super_base_blob<256U>.m_data._M_elems[7];
  local_248[8] = scriptHash.super_base_blob<256U>.m_data._M_elems[8];
  local_248[9] = scriptHash.super_base_blob<256U>.m_data._M_elems[9];
  local_248[10] = scriptHash.super_base_blob<256U>.m_data._M_elems[10];
  local_248[0xb] = scriptHash.super_base_blob<256U>.m_data._M_elems[0xb];
  local_248[0xc] = scriptHash.super_base_blob<256U>.m_data._M_elems[0xc];
  local_248[0xd] = scriptHash.super_base_blob<256U>.m_data._M_elems[0xd];
  local_248[0xe] = scriptHash.super_base_blob<256U>.m_data._M_elems[0xe];
  local_248[0xf] = scriptHash.super_base_blob<256U>.m_data._M_elems[0xf];
  local_200 = '\x03';
  GetScriptForDestination(&witnessScript,(CTxDestination *)local_248);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&result.super_CScriptBase,&witnessScript.super_CScriptBase);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&witnessScript.super_CScriptBase);
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)local_248);
  local_2c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_2c0 = "";
  local_2d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x12d;
  file_00.m_begin = (iterator)&local_2c8;
  msg_00.m_end = pvVar8;
  msg_00.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_2d8,
             msg_00);
  bVar3 = prevector<28U,_unsigned_char,_unsigned_int,_int>::operator==
                    (&result.super_CScriptBase,&expected.super_CScriptBase);
  witnessScript.super_CScriptBase._union.direct[0] = bVar3;
  witnessScript.super_CScriptBase._union._8_8_ = 0;
  witnessScript.super_CScriptBase._union._16_8_ = 0;
  scriptHash.super_base_blob<256U>.m_data._M_elems._0_8_ = anon_var_dwarf_ea86ab;
  scriptHash.super_base_blob<256U>.m_data._M_elems._8_8_ = (long)"result == expected" + 0x12;
  local_248._8_8_ = local_248._8_8_ & 0xffffffffffffff00;
  local_248._0_8_ = &PTR__lazy_ostream_011481f0;
  local_248._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_2e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_2e0 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  local_248._24_8_ = &scriptHash;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&witnessScript,(lazy_ostream *)local_248,1,0,WARN,_cVar9,
             (size_t)&local_2e8,0x12d);
  boost::detail::shared_count::~shared_count
            ((shared_count *)((long)&witnessScript.super_CScriptBase._union + 0x10));
  CScript::clear(&expected);
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  local_248._0_8_ = (pointer)0x0;
  local_248._8_8_ = (pointer)0x0;
  local_248._16_8_ = (pointer)0x0;
  local_248[0x18] = '\0';
  local_248[0x19] = '\0';
  local_248[0x1a] = '\0';
  local_248[0x1b] = '\0';
  local_248[0x1c] = '\0';
  local_248[0x1d] = '\0';
  local_248[0x1e] = '\0';
  local_248[0x1f] = '\0';
  local_200 = '\0';
  GetScriptForDestination(&witnessScript,(CTxDestination *)local_248);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&result.super_CScriptBase,&witnessScript.super_CScriptBase);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&witnessScript.super_CScriptBase);
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)local_248);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&scriptHash);
  local_2f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_2f0 = "";
  local_308 = &boost::unit_test::basic_cstring<char_const>::null;
  local_300 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x132;
  file_01.m_begin = (iterator)&local_2f8;
  msg_01.m_end = pvVar8;
  msg_01.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_308,
             msg_01);
  bVar3 = prevector<28U,_unsigned_char,_unsigned_int,_int>::operator==
                    (&result.super_CScriptBase,&expected.super_CScriptBase);
  witnessScript.super_CScriptBase._union.direct[0] = bVar3;
  witnessScript.super_CScriptBase._union._8_8_ = 0;
  witnessScript.super_CScriptBase._union._16_8_ = 0;
  scriptHash.super_base_blob<256U>.m_data._M_elems._0_8_ = anon_var_dwarf_ea86ab;
  scriptHash.super_base_blob<256U>.m_data._M_elems._8_8_ = (long)"result == expected" + 0x12;
  local_248._8_8_ = local_248._8_8_ & 0xffffffffffffff00;
  local_248._0_8_ = &PTR__lazy_ostream_011481f0;
  local_248._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_318 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_310 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  local_248._24_8_ = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)&scriptHash;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&witnessScript,(lazy_ostream *)local_248,1,0,WARN,_cVar9,
             (size_t)&local_318,0x132);
  boost::detail::shared_count::~shared_count
            ((shared_count *)((long)&witnessScript.super_CScriptBase._union + 0x10));
  CScript::clear(&expected);
  ToByteVector<CPubKey>((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_248,pubkeys);
  pCVar5 = CScript::operator<<(&expected,
                               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_248);
  CScript::operator<<(pCVar5,OP_CHECKSIG);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_248);
  GetScriptForRawPubKey((CScript *)local_248,pubkeys);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&result.super_CScriptBase,(prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_248
            );
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_248);
  local_328 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_320 = "";
  local_338 = &boost::unit_test::basic_cstring<char_const>::null;
  local_330 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x138;
  file_02.m_begin = (iterator)&local_328;
  msg_02.m_end = pvVar8;
  msg_02.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_338,
             msg_02);
  bVar3 = prevector<28U,_unsigned_char,_unsigned_int,_int>::operator==
                    (&result.super_CScriptBase,&expected.super_CScriptBase);
  witnessScript.super_CScriptBase._union.direct[0] = bVar3;
  witnessScript.super_CScriptBase._union._8_8_ = 0;
  witnessScript.super_CScriptBase._union._16_8_ = 0;
  scriptHash.super_base_blob<256U>.m_data._M_elems._0_8_ = anon_var_dwarf_ea86ab;
  scriptHash.super_base_blob<256U>.m_data._M_elems._8_8_ = (long)"result == expected" + 0x12;
  local_248._8_8_ = local_248._8_8_ & 0xffffffffffffff00;
  local_248._0_8_ = &PTR__lazy_ostream_011481f0;
  local_248._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_348 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_340 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  local_248._24_8_ = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)&scriptHash;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&witnessScript,(lazy_ostream *)local_248,1,0,WARN,_cVar9,
             (size_t)&local_348,0x138);
  boost::detail::shared_count::~shared_count
            ((shared_count *)((long)&witnessScript.super_CScriptBase._union + 0x10));
  CScript::clear(&expected);
  pCVar5 = CScript::operator<<(&expected,OP_2);
  ToByteVector<CPubKey>((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_248,pubkeys);
  pCVar5 = CScript::operator<<(pCVar5,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                      local_248);
  ToByteVector<CPubKey>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&witnessScript,pubkeys + 1);
  pCVar5 = CScript::operator<<(pCVar5,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                      &witnessScript);
  ToByteVector<CPubKey>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&scriptHash,pubkeys + 2);
  pCVar5 = CScript::operator<<(pCVar5,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                      &scriptHash);
  pCVar5 = CScript::operator<<(pCVar5,OP_3);
  CScript::operator<<(pCVar5,OP_CHECKMULTISIG);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&scriptHash);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&witnessScript);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_248);
  std::vector<CPubKey,std::allocator<CPubKey>>::vector<CPubKey*,void>
            ((vector<CPubKey,std::allocator<CPubKey>> *)&witnessScript,pubkeys,(CPubKey *)local_75,
             (allocator_type *)&scriptHash);
  GetScriptForMultisig
            ((CScript *)local_248,2,(vector<CPubKey,_std::allocator<CPubKey>_> *)&witnessScript);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&result.super_CScriptBase,(prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_248
            );
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_248);
  std::_Vector_base<CPubKey,_std::allocator<CPubKey>_>::~_Vector_base
            ((_Vector_base<CPubKey,_std::allocator<CPubKey>_> *)&witnessScript);
  local_358 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_350 = "";
  local_368 = &boost::unit_test::basic_cstring<char_const>::null;
  local_360 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x142;
  file_03.m_begin = (iterator)&local_358;
  msg_03.m_end = pvVar8;
  msg_03.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_368,
             msg_03);
  bVar3 = prevector<28U,_unsigned_char,_unsigned_int,_int>::operator==
                    (&result.super_CScriptBase,&expected.super_CScriptBase);
  witnessScript.super_CScriptBase._union.direct[0] = bVar3;
  witnessScript.super_CScriptBase._union._8_8_ = 0;
  witnessScript.super_CScriptBase._union._16_8_ = 0;
  scriptHash.super_base_blob<256U>.m_data._M_elems._0_8_ = anon_var_dwarf_ea86ab;
  scriptHash.super_base_blob<256U>.m_data._M_elems._8_8_ = (long)"result == expected" + 0x12;
  local_248._8_8_ = local_248._8_8_ & 0xffffffffffffff00;
  local_248._0_8_ = &PTR__lazy_ostream_011481f0;
  local_248._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_378 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_370 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  local_248._24_8_ = (allocator_type *)&scriptHash;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&witnessScript,(lazy_ostream *)local_248,1,0,WARN,_cVar9,
             (size_t)&local_378,0x142);
  boost::detail::shared_count::~shared_count
            ((shared_count *)((long)&witnessScript.super_CScriptBase._union + 0x10));
  CScript::clear(&expected);
  pCVar5 = CScript::operator<<(&expected,OP_0);
  CPubKey::GetID((CKeyID *)&witnessScript,pubkeys);
  ToByteVector<CKeyID>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_248,
             (CKeyID *)&witnessScript);
  CScript::operator<<(pCVar5,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_248);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_248);
  ToByteVector<CPubKey>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&scriptHash,pubkeys);
  Hash160<std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ((uint160 *)local_268,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&scriptHash);
  local_248._16_4_ = local_268._16_4_;
  local_248._8_8_ = local_268._8_8_;
  local_200 = '\x05';
  GetScriptForDestination(&witnessScript,(CTxDestination *)local_248);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&result.super_CScriptBase,&witnessScript.super_CScriptBase);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&witnessScript.super_CScriptBase);
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)local_248);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&scriptHash);
  local_388 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_380 = "";
  local_398 = &boost::unit_test::basic_cstring<char_const>::null;
  local_390 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x148;
  file_04.m_begin = (iterator)&local_388;
  msg_04.m_end = pvVar8;
  msg_04.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_398,
             msg_04);
  bVar3 = prevector<28U,_unsigned_char,_unsigned_int,_int>::operator==
                    (&result.super_CScriptBase,&expected.super_CScriptBase);
  witnessScript.super_CScriptBase._union.direct[0] = bVar3;
  witnessScript.super_CScriptBase._union._8_8_ = 0;
  witnessScript.super_CScriptBase._union._16_8_ = 0;
  scriptHash.super_base_blob<256U>.m_data._M_elems._0_8_ = anon_var_dwarf_ea86ab;
  scriptHash.super_base_blob<256U>.m_data._M_elems._8_8_ = (long)"result == expected" + 0x12;
  local_248._8_8_ = local_248._8_8_ & 0xffffffffffffff00;
  local_248._0_8_ = &PTR__lazy_ostream_011481f0;
  local_248._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_3a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_3a0 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  local_248._24_8_ = &scriptHash;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&witnessScript,(lazy_ostream *)local_248,1,0,WARN,_cVar9,
             (size_t)&local_3a8,0x148);
  boost::detail::shared_count::~shared_count
            ((shared_count *)((long)&witnessScript.super_CScriptBase._union + 0x10));
  CPubKey::GetID((CKeyID *)&scriptHash,pubkeys);
  uVar2 = scriptHash.super_base_blob<256U>.m_data._M_elems._16_8_;
  local_248[0x10] = scriptHash.super_base_blob<256U>.m_data._M_elems[0x10];
  local_248[0x11] = scriptHash.super_base_blob<256U>.m_data._M_elems[0x11];
  local_248[0x12] = scriptHash.super_base_blob<256U>.m_data._M_elems[0x12];
  local_248[0x13] = scriptHash.super_base_blob<256U>.m_data._M_elems[0x13];
  local_248[0] = scriptHash.super_base_blob<256U>.m_data._M_elems[0];
  local_248[1] = scriptHash.super_base_blob<256U>.m_data._M_elems[1];
  local_248[2] = scriptHash.super_base_blob<256U>.m_data._M_elems[2];
  local_248[3] = scriptHash.super_base_blob<256U>.m_data._M_elems[3];
  local_248[4] = scriptHash.super_base_blob<256U>.m_data._M_elems[4];
  local_248[5] = scriptHash.super_base_blob<256U>.m_data._M_elems[5];
  local_248[6] = scriptHash.super_base_blob<256U>.m_data._M_elems[6];
  local_248[7] = scriptHash.super_base_blob<256U>.m_data._M_elems[7];
  local_248[8] = scriptHash.super_base_blob<256U>.m_data._M_elems[8];
  local_248[9] = scriptHash.super_base_blob<256U>.m_data._M_elems[9];
  local_248[10] = scriptHash.super_base_blob<256U>.m_data._M_elems[10];
  local_248[0xb] = scriptHash.super_base_blob<256U>.m_data._M_elems[0xb];
  local_248[0xc] = scriptHash.super_base_blob<256U>.m_data._M_elems[0xc];
  local_248[0xd] = scriptHash.super_base_blob<256U>.m_data._M_elems[0xd];
  local_248[0xe] = scriptHash.super_base_blob<256U>.m_data._M_elems[0xe];
  local_248[0xf] = scriptHash.super_base_blob<256U>.m_data._M_elems[0xf];
  local_200 = '\x05';
  scriptHash.super_base_blob<256U>.m_data._M_elems._16_8_ = uVar2;
  GetScriptForDestination(&witnessScript,(CTxDestination *)local_248);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&result.super_CScriptBase,&witnessScript.super_CScriptBase);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&witnessScript.super_CScriptBase);
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)local_248);
  local_3b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_3b0 = "";
  local_3c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x14a;
  file_05.m_begin = (iterator)&local_3b8;
  msg_05.m_end = pvVar8;
  msg_05.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_3c8,
             msg_05);
  bVar3 = prevector<28U,_unsigned_char,_unsigned_int,_int>::operator==
                    (&result.super_CScriptBase,&expected.super_CScriptBase);
  witnessScript.super_CScriptBase._union.direct[0] = bVar3;
  witnessScript.super_CScriptBase._union._8_8_ = 0;
  witnessScript.super_CScriptBase._union._16_8_ = 0;
  scriptHash.super_base_blob<256U>.m_data._M_elems._0_8_ = anon_var_dwarf_ea86ab;
  scriptHash.super_base_blob<256U>.m_data._M_elems._8_8_ = (long)"result == expected" + 0x12;
  local_248._8_8_ = local_248._8_8_ & 0xffffffffffffff00;
  local_248._0_8_ = &PTR__lazy_ostream_011481f0;
  local_248._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_3d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_3d0 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  local_248._24_8_ = &scriptHash;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&witnessScript,(lazy_ostream *)local_248,1,0,WARN,_cVar9,
             (size_t)&local_3d8,0x14a);
  boost::detail::shared_count::~shared_count
            ((shared_count *)((long)&witnessScript.super_CScriptBase._union + 0x10));
  witnessScript.super_CScriptBase._union._16_8_ = 0;
  witnessScript.super_CScriptBase._24_8_ = 0;
  witnessScript.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  witnessScript.super_CScriptBase._union._8_8_ = 0;
  pCVar5 = CScript::operator<<(&witnessScript,OP_1);
  ToByteVector<CPubKey>((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_248,pubkeys);
  pCVar5 = CScript::operator<<(pCVar5,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                      local_248);
  pCVar5 = CScript::operator<<(pCVar5,OP_1);
  CScript::operator<<(pCVar5,OP_CHECKMULTISIG);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_248);
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  scriptHash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  CSHA256::CSHA256((CSHA256 *)local_248);
  uVar6 = witnessScript.super_CScriptBase._size - 0x1d;
  uVar2 = witnessScript.super_CScriptBase._union.indirect_contents.indirect;
  if (witnessScript.super_CScriptBase._size < 0x1d) {
    uVar6 = witnessScript.super_CScriptBase._size;
    uVar2 = &witnessScript;
  }
  this_00 = CSHA256::Write((CSHA256 *)local_248,(uchar *)uVar2,(ulong)uVar6);
  CSHA256::Finalize(this_00,(uchar *)&scriptHash);
  CScript::clear(&expected);
  pCVar5 = CScript::operator<<(&expected,OP_0);
  ToByteVector<uint256>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_248,&scriptHash);
  CScript::operator<<(pCVar5,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_248);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_248);
  WitnessV0ScriptHash::WitnessV0ScriptHash((WitnessV0ScriptHash *)&local_288,&witnessScript);
  local_248._16_8_ = local_278;
  local_248[0x18] = auStack_270[0];
  local_248[0x19] = auStack_270[1];
  local_248[0x1a] = auStack_270[2];
  local_248[0x1b] = auStack_270[3];
  local_248[0x1c] = auStack_270[4];
  local_248[0x1d] = auStack_270[5];
  local_248[0x1e] = auStack_270[6];
  local_248[0x1f] = auStack_270[7];
  local_248._0_8_ = local_288;
  local_248._8_8_ = puStack_280;
  local_200 = '\x04';
  GetScriptForDestination((CScript *)local_268,(CTxDestination *)local_248);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&result.super_CScriptBase,(prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_268
            );
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_268);
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)local_248);
  local_3e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_3e0 = "";
  local_3f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x157;
  file_06.m_begin = (iterator)&local_3e8;
  msg_06.m_end = pvVar8;
  msg_06.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_3f8,
             msg_06);
  local_268[0] = prevector<28U,_unsigned_char,_unsigned_int,_int>::operator==
                           (&result.super_CScriptBase,&expected.super_CScriptBase);
  local_268[8] = '\0';
  local_268[9] = '\0';
  local_268[10] = '\0';
  local_268[0xb] = '\0';
  local_268[0xc] = '\0';
  local_268[0xd] = '\0';
  local_268[0xe] = '\0';
  local_268[0xf] = '\0';
  local_268._16_8_ = 0;
  local_288 = "result == expected";
  puStack_280 = "";
  local_248._8_8_ = local_248._8_8_ & 0xffffffffffffff00;
  local_248._0_8_ = &PTR__lazy_ostream_011481f0;
  local_248._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_408 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_400 = "";
  local_248._24_8_ = (WitnessV0ScriptHash *)&local_288;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_268,(lazy_ostream *)local_248,1,0,WARN,_cVar9,
             (size_t)&local_408,0x157);
  boost::detail::shared_count::~shared_count((shared_count *)(local_268 + 0x10));
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&witnessScript.super_CScriptBase);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&redeemScript.super_CScriptBase);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&result.super_CScriptBase);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&expected.super_CScriptBase);
  lVar4 = 0x28;
  do {
    std::
    unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
    ::~unique_ptr((unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                   *)(&keys[0].fCompressed + lVar4));
    lVar4 = lVar4 + -0x10;
  } while (lVar4 != -8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(script_standard_GetScriptFor_)
{
    CKey keys[3];
    CPubKey pubkeys[3];
    for (int i = 0; i < 3; i++) {
        keys[i].MakeNewKey(true);
        pubkeys[i] = keys[i].GetPubKey();
    }

    CScript expected, result;

    // PKHash
    expected.clear();
    expected << OP_DUP << OP_HASH160 << ToByteVector(pubkeys[0].GetID()) << OP_EQUALVERIFY << OP_CHECKSIG;
    result = GetScriptForDestination(PKHash(pubkeys[0]));
    BOOST_CHECK(result == expected);

    // CScriptID
    CScript redeemScript(result);
    expected.clear();
    expected << OP_HASH160 << ToByteVector(CScriptID(redeemScript)) << OP_EQUAL;
    result = GetScriptForDestination(ScriptHash(redeemScript));
    BOOST_CHECK(result == expected);

    // CNoDestination
    expected.clear();
    result = GetScriptForDestination(CNoDestination());
    BOOST_CHECK(result == expected);

    // GetScriptForRawPubKey
    expected.clear();
    expected << ToByteVector(pubkeys[0]) << OP_CHECKSIG;
    result = GetScriptForRawPubKey(pubkeys[0]);
    BOOST_CHECK(result == expected);

    // GetScriptForMultisig
    expected.clear();
    expected << OP_2 <<
        ToByteVector(pubkeys[0]) <<
        ToByteVector(pubkeys[1]) <<
        ToByteVector(pubkeys[2]) <<
        OP_3 << OP_CHECKMULTISIG;
    result = GetScriptForMultisig(2, std::vector<CPubKey>(pubkeys, pubkeys + 3));
    BOOST_CHECK(result == expected);

    // WitnessV0KeyHash
    expected.clear();
    expected << OP_0 << ToByteVector(pubkeys[0].GetID());
    result = GetScriptForDestination(WitnessV0KeyHash(Hash160(ToByteVector(pubkeys[0]))));
    BOOST_CHECK(result == expected);
    result = GetScriptForDestination(WitnessV0KeyHash(pubkeys[0].GetID()));
    BOOST_CHECK(result == expected);

    // WitnessV0ScriptHash (multisig)
    CScript witnessScript;
    witnessScript << OP_1 << ToByteVector(pubkeys[0]) << OP_1 << OP_CHECKMULTISIG;

    uint256 scriptHash;
    CSHA256().Write(witnessScript.data(), witnessScript.size())
        .Finalize(scriptHash.begin());

    expected.clear();
    expected << OP_0 << ToByteVector(scriptHash);
    result = GetScriptForDestination(WitnessV0ScriptHash(witnessScript));
    BOOST_CHECK(result == expected);
}